

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t len;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  undefined8 *puVar13;
  bool bVar14;
  undefined4 local_3c;
  
  puVar13 = smain_0;
  pcVar5 = (char *)*smain_0;
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    progname = pcVar5;
  }
  globalL = L;
  luaJIT_version_2_1_0_beta3();
  uVar7 = 1;
  uVar8 = 0;
LAB_00108869:
  pcVar5 = (char *)puVar13[(int)uVar7];
  if ((pcVar5 == (char *)0x0) || (*pcVar5 != '-')) goto LAB_00108922;
  cVar1 = pcVar5[1];
  uVar12 = 2;
  switch(cVar1) {
  case 'b':
    if (uVar8 != 0) goto switchD_00108898_caseD_63;
    uVar7 = uVar7 + 1;
    uVar8 = 4;
LAB_00108922:
    if ((int)uVar7 < 0) {
switchD_00108898_caseD_63:
      fputs("usage: ",_stderr);
      fputs(progname,_stderr);
      fputs(" [options]... [script [args]...].\nAvailable options are:\n  -e chunk  Execute string \'chunk\'.\n  -l name   Require library \'name\'.\n  -b ...    Save or list bytecode.\n  -j cmd    Perform LuaJIT control command.\n  -O[opt]   Control LuaJIT optimizations.\n  -i        Enter interactive mode after executing \'script\'.\n  -v        Show version information.\n  -E        Ignore environment variables.\n  --        Stop handling options.\n  -         Execute stdin and stop handling options.\n"
            ,_stderr);
      fflush(_stderr);
      smain_2 = 1;
      return 0;
    }
    if ((uVar8 & 0x10) != 0) {
      lua_pushboolean(L,1);
      lua_setfield(L,-10000,"LUA_NOENV");
    }
    uVar9 = 0;
    lua_gc(L,0,0);
    luaL_openlibs(L);
    local_3c = 1;
    lua_gc(L,1,-1);
    uVar12 = smain_1;
    lua_createtable(L,smain_1 - uVar7,uVar7);
    uVar11 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      lua_pushstring(L,(char *)puVar13[uVar9]);
      lua_rawseti(L,-2,(int)uVar9 - uVar7);
    }
    lua_setfield(L,-0x2712,"arg");
    if ((uVar8 & 0x10) == 0) {
      pcVar5 = getenv("LUA_INIT");
      if (pcVar5 == (char *)0x0) {
        smain_2 = 0;
      }
      else {
        if (*pcVar5 == '@') {
          smain_2 = dofile(L,pcVar5 + 1);
        }
        else {
          smain_2 = dostring(L,pcVar5,"=LUA_INIT");
        }
        if (smain_2 != 0) {
          return 0;
        }
      }
    }
    if ((uVar8 & 2) != 0) {
      print_version();
    }
    iVar4 = 1;
    do {
      if ((int)uVar7 <= iVar4) {
        smain_2 = 0;
        if ((int)uVar7 < (int)smain_1) {
          pcVar5 = (char *)puVar13[uVar7];
          if ((*pcVar5 == '-') && (pcVar5[1] == '\0')) {
            pcVar6 = (char *)puVar13[(ulong)uVar7 - 1];
            if ((*pcVar6 == '-') && (pcVar6[1] == '-')) {
              if (pcVar6[2] != '\0') {
                pcVar5 = (char *)0x0;
              }
            }
            else {
              pcVar5 = (char *)0x0;
            }
          }
          iVar4 = luaL_loadfile(L,pcVar5);
          if (iVar4 == 0) {
            lua_getfield(L,-0x2712,"arg");
            iVar4 = lua_type(L,-1);
            if (iVar4 == 5) {
              uVar12 = 0;
              iVar4 = 1;
              do {
                uVar12 = uVar12 - 1;
                lua_rawgeti(L,uVar12,iVar4);
                iVar3 = lua_type(L,-1);
                iVar4 = iVar4 + 1;
              } while (iVar3 != 0);
              lua_settop(L,-2);
              lua_remove(L,uVar12);
              uVar12 = ~uVar12;
            }
            else {
              lua_settop(L,-2);
              uVar12 = 0;
            }
            iVar4 = docall(L,uVar12,0);
          }
          report(L,iVar4);
          smain_2 = iVar4;
          if (iVar4 != 0) {
            return 0;
          }
        }
        if ((uVar8 & 1) == 0) {
          if ((uVar8 & 6) != 0) {
            return 0;
          }
          if (smain_1 != uVar7) {
            return 0;
          }
          iVar4 = isatty(0);
          if (iVar4 == 0) {
            dofile(L,(char *)0x0);
            return 0;
          }
          print_version();
        }
        print_jit_status(L);
        dotty(L);
        return 0;
      }
      lVar2 = puVar13[iVar4];
      if (lVar2 != 0) {
        cVar1 = *(char *)(lVar2 + 1);
        if (cVar1 == 'O') {
          lua_getfield(L,-10000,"_LOADED");
          lua_getfield(L,-1,"jit.opt");
          lua_remove(L,-2);
          lua_getfield(L,-1,"start");
          lua_remove(L,-2);
          iVar3 = runcmdopt(L,(char *)(lVar2 + 2));
        }
        else if (cVar1 == 'e') {
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar10 = iVar4 + 1;
            pcVar5 = (char *)puVar13[(long)iVar4 + 1];
          }
          else {
            pcVar5 = (char *)(lVar2 + 2);
            iVar10 = iVar4;
          }
          iVar3 = dostring(L,pcVar5,"=(command line)");
          iVar4 = iVar10;
        }
        else if (cVar1 == 'j') {
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar10 = iVar4 + 1;
            pcVar5 = (char *)puVar13[(long)iVar4 + 1];
          }
          else {
            pcVar5 = (char *)(lVar2 + 2);
            iVar10 = iVar4;
          }
          pcVar6 = strchr(pcVar5,0x3d);
          if (pcVar6 == (char *)0x0) {
            len = strlen(pcVar5);
          }
          else {
            len = (long)pcVar6 - (long)pcVar5;
          }
          lua_pushlstring(L,pcVar5,len);
          lua_getfield(L,-10000,"_LOADED");
          lua_getfield(L,-1,"jit");
          lua_remove(L,-2);
          lua_pushvalue(L,-2);
          lua_gettable(L,-2);
          iVar4 = lua_type(L,-1);
          if (iVar4 == 6) {
            lua_remove(L,-2);
          }
          else {
            lua_settop(L,-3);
            iVar4 = loadjitmodule(L);
            if (iVar4 != 0) {
              smain_2 = 1;
              return 0;
            }
          }
          lua_remove(L,-2);
          pcVar5 = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            pcVar5 = (char *)0x0;
          }
          iVar3 = runcmdopt(L,pcVar5);
          iVar4 = iVar10;
        }
        else {
          if (cVar1 != 'l') {
            if (cVar1 == 'b') {
              lua_pushlstring(L,"bcsave",6);
              iVar3 = loadjitmodule(L);
              if (iVar3 == 0) {
                bVar14 = *(char *)(puVar13[iVar4] + 2) != '\0';
                if (bVar14) {
                  *(undefined1 *)(puVar13[iVar4] + 1) = 0x2d;
                  lua_pushstring(L,(char *)(puVar13[iVar4] + 1));
                }
                uVar7 = (uint)bVar14;
                puVar13 = puVar13 + iVar4;
                while( true ) {
                  puVar13 = puVar13 + 1;
                  if ((char *)*puVar13 == (char *)0x0) break;
                  lua_pushstring(L,(char *)*puVar13);
                  uVar7 = uVar7 + 1;
                }
                iVar4 = lua_pcall(L,uVar7,0,0);
                report(L,iVar4);
                local_3c = 0xffffffff;
              }
              smain_2 = local_3c;
              return 0;
            }
            goto LAB_00108c84;
          }
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar10 = iVar4 + 1;
            pcVar5 = (char *)puVar13[(long)iVar4 + 1];
          }
          else {
            pcVar5 = (char *)(lVar2 + 2);
            iVar10 = iVar4;
          }
          lua_getfield(L,-0x2712,"require");
          lua_pushstring(L,pcVar5);
          iVar3 = docall(L,1,1);
          report(L,iVar3);
          iVar4 = iVar10;
        }
        if (iVar3 != 0) {
          smain_2 = 1;
          return 0;
        }
      }
LAB_00108c84:
      iVar4 = iVar4 + 1;
    } while( true );
  case 'c':
  case 'd':
  case 'f':
  case 'g':
  case 'h':
  case 'k':
    goto switchD_00108898_caseD_63;
  case 'e':
    uVar8 = uVar8 | 4;
  case 'j':
  case 'l':
    uVar8 = uVar8 | 8;
    if (pcVar5[2] == '\0') {
      if (puVar13[(long)(int)uVar7 + 1] == 0) goto switchD_00108898_caseD_63;
      uVar7 = uVar7 + 1;
    }
    break;
  case 'i':
    if (pcVar5[2] != '\0') goto switchD_00108898_caseD_63;
    uVar8 = uVar8 | 1;
LAB_001088ec:
    uVar8 = uVar8 | uVar12;
    break;
  default:
    if (cVar1 == 'E') {
      uVar12 = 0x10;
      goto LAB_001088ec;
    }
    if (cVar1 != 'O') {
      if (cVar1 == 'v') {
        if (pcVar5[2] == '\0') goto LAB_001088ec;
        goto switchD_00108898_caseD_63;
      }
      if (cVar1 != '\0') {
        if ((cVar1 != '-') || (pcVar5[2] != '\0')) goto switchD_00108898_caseD_63;
        uVar7 = uVar7 + 1;
      }
      goto LAB_00108922;
    }
  }
  uVar7 = uVar7 + 1;
  goto LAB_00108869;
}

Assistant:

static int pmain(lua_State *L)
{
  struct Smain *s = &smain;
  char **argv = s->argv;
  int argn;
  int flags = 0;
  globalL = L;
  if (argv[0] && argv[0][0]) progname = argv[0];

  LUAJIT_VERSION_SYM();  /* Linker-enforced version check. */

  argn = collectargs(argv, &flags);
  if (argn < 0) {  /* Invalid args? */
    print_usage();
    s->status = 1;
    return 0;
  }

  if ((flags & FLAGS_NOENV)) {
    lua_pushboolean(L, 1);
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }

  /* Stop collector during library initialization. */
  lua_gc(L, LUA_GCSTOP, 0);
  luaL_openlibs(L);
  lua_gc(L, LUA_GCRESTART, -1);

  createargtable(L, argv, s->argc, argn);

  if (!(flags & FLAGS_NOENV)) {
    s->status = handle_luainit(L);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_VERSION)) print_version();

  s->status = runargs(L, argv, argn);
  if (s->status != LUA_OK) return 0;

  if (s->argc > argn) {
    s->status = handle_script(L, argv + argn);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_INTERACTIVE)) {
    print_jit_status(L);
    dotty(L);
  } else if (s->argc == argn && !(flags & (FLAGS_EXEC|FLAGS_VERSION))) {
    if (lua_stdin_is_tty()) {
      print_version();
      print_jit_status(L);
      dotty(L);
    } else {
      dofile(L, NULL);  /* Executes stdin as a file. */
    }
  }
  return 0;
}